

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_encoder_optimum_normal.c
# Opt level: O0

uint32_t helper1(lzma_lzma1_encoder *coder,lzma_mf *mf,uint32_t *back_res,uint32_t *len_res,
                uint32_t position)

{
  byte bVar1;
  byte bVar2;
  uint16_t uVar3;
  uint16_t uVar4;
  uint32_t uVar5;
  uint uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  uint uVar9;
  uint32_t uVar10;
  uint8_t *puVar11;
  uint64_t uVar12;
  uint64_t uVar13;
  ulong uVar14;
  uint local_10c;
  uint local_fc;
  uint local_ec;
  uint local_dc;
  uint32_t cur_and_len_price_1;
  uint32_t dist;
  uint32_t i_3;
  uint32_t normal_match_price;
  uint32_t cur_and_len_price;
  uint32_t price;
  uint32_t rep_len;
  uint32_t i_2;
  uint32_t len;
  uint32_t i_1;
  uint32_t len_end;
  uint32_t short_rep_price;
  uint32_t rep_match_price;
  uint32_t match_price;
  uint32_t pos_state;
  uint8_t match_byte;
  uint8_t current_byte;
  uint8_t *buf_back;
  uint32_t i;
  uint32_t rep_max_index;
  uint32_t rep_lens [4];
  uint8_t *buf;
  uint32_t local_68;
  uint32_t buf_avail;
  uint32_t matches_count;
  uint32_t len_main;
  uint32_t nice_len;
  uint32_t position_local;
  uint32_t *len_res_local;
  uint32_t *back_res_local;
  lzma_mf *mf_local;
  lzma_lzma1_encoder *coder_local;
  ulong local_30;
  uint64_t x;
  uint8_t *local_20;
  long local_18;
  uint local_c;
  
  matches_count = mf->nice_len;
  len_main = position;
  _nice_len = len_res;
  len_res_local = back_res;
  back_res_local = (uint32_t *)mf;
  mf_local = (lzma_mf *)coder;
  if (mf->read_ahead == 0) {
    buf_avail = lzma_mf_find(mf,&local_68,coder->matches);
  }
  else {
    if (mf->read_ahead != 1) {
      __assert_fail("mf->read_ahead == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_encoder_optimum_normal.c"
                    ,0x11c,
                    "uint32_t helper1(lzma_lzma1_encoder *restrict, lzma_mf *restrict, uint32_t *restrict, uint32_t *restrict, uint32_t)"
                   );
    }
    buf_avail = coder->longest_match_length;
    local_68 = coder->matches_count;
  }
  uVar5 = mf_avail((lzma_mf *)back_res_local);
  if (uVar5 + 1 < 0x111) {
    uVar5 = mf_avail((lzma_mf *)back_res_local);
    local_dc = uVar5 + 1;
  }
  else {
    local_dc = 0x111;
  }
  if (local_dc < 2) {
    *len_res_local = 0xffffffff;
    *_nice_len = 1;
    coder_local._4_4_ = 0xffffffff;
  }
  else {
    puVar11 = mf_ptr((lzma_mf *)back_res_local);
    rep_lens._8_8_ = puVar11 + -1;
    buf_back._4_4_ = 0;
    for (buf_back._0_4_ = 0; (uint)buf_back < 4; buf_back._0_4_ = (uint)buf_back + 1) {
      puVar11 = (uint8_t *)((rep_lens._8_8_ - (ulong)(&mf_local[6].offset)[(uint)buf_back]) + -1);
      uVar3 = read16ne((uint8_t *)rep_lens._8_8_);
      uVar4 = read16ne(puVar11);
      if (uVar3 == uVar4) {
        local_18._0_4_ = rep_lens[2];
        local_18._4_4_ = rep_lens[3];
        local_20 = puVar11;
        x._4_4_ = 2;
        x._0_4_ = local_dc;
        if (local_dc < 2) {
          __assert_fail("len <= limit",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/common/memcmplen.h"
                        ,0x2e,
                        "uint32_t lzma_memcmplen(const uint8_t *, const uint8_t *, uint32_t, uint32_t)"
                       );
        }
        if (0x7fffffff < local_dc) {
          __assert_fail("limit <= UINT32_MAX / 2",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/common/memcmplen.h"
                        ,0x2f,
                        "uint32_t lzma_memcmplen(const uint8_t *, const uint8_t *, uint32_t, uint32_t)"
                       );
        }
LAB_0022a4a8:
        if (x._4_4_ < (uint)x) {
          uVar12 = read64ne((uint8_t *)(local_18 + (ulong)x._4_4_));
          uVar13 = read64ne(local_20 + x._4_4_);
          uVar14 = uVar12 - uVar13;
          local_30 = uVar14;
          if (uVar14 == 0) goto LAB_0022a52a;
          uVar6 = 0;
          for (; (uVar14 & 1) == 0; uVar14 = uVar14 >> 1 | 0x8000000000000000) {
            uVar6 = uVar6 + 1;
          }
          local_ec = (uVar6 >> 3) + x._4_4_;
          x._4_4_ = local_ec;
          if ((uint)x <= local_ec) {
            local_ec = (uint)x;
          }
          local_c = local_ec;
        }
        else {
          local_c = (uint)x;
        }
        (&i)[(uint)buf_back] = local_c;
        if ((&i)[buf_back._4_4_] < (&i)[(uint)buf_back]) {
          buf_back._4_4_ = (uint)buf_back;
        }
      }
      else {
        (&i)[(uint)buf_back] = 0;
      }
    }
    if ((&i)[buf_back._4_4_] < matches_count) {
      if (buf_avail < matches_count) {
        bVar1 = *(byte *)rep_lens._8_8_;
        bVar2 = *(byte *)((rep_lens._8_8_ + -1) - (ulong)mf_local[6].offset);
        if (((buf_avail < 2) && (bVar1 != bVar2)) && ((&i)[buf_back._4_4_] < 2)) {
          *len_res_local = 0xffffffff;
          *_nice_len = 1;
          coder_local._4_4_ = 0xffffffff;
        }
        else {
          mf_local[0x241].hash_count = mf_local[6].keep_size_after;
          uVar6 = len_main & mf_local[0x18].cyclic_pos;
          uVar5 = rc_bit_0_price(*(probability *)
                                  ((long)&mf_local[0xe5].hash +
                                  (ulong)uVar6 * 2 + (ulong)mf_local[6].keep_size_after * 0x20 + 4))
          ;
          uVar7 = get_literal_price((lzma_lzma1_encoder *)mf_local,len_main,
                                    (uint)*(byte *)(rep_lens._8_8_ + -1),
                                    (_Bool)((mf_local[6].keep_size_after < 7 ^ 0xffU) & 1),
                                    (uint)bVar2,(uint)bVar1);
          *(uint32_t *)&mf_local[0x242].find = uVar5 + uVar7;
          make_literal((lzma_optimal *)&mf_local[0x242].read_limit);
          uVar5 = rc_bit_1_price(*(probability *)
                                  ((long)&mf_local[0xe5].hash +
                                  (ulong)uVar6 * 2 + (ulong)mf_local[6].keep_size_after * 0x20 + 4))
          ;
          uVar7 = rc_bit_1_price(*(probability *)
                                  ((long)&mf_local[0xe8].depth +
                                  (ulong)mf_local[6].keep_size_after * 2));
          if (bVar2 == bVar1) {
            uVar8 = get_short_rep_price((lzma_lzma1_encoder *)mf_local,mf_local[6].keep_size_after,
                                        uVar6);
            uVar9 = uVar5 + uVar7 + uVar8;
            if (uVar9 < *(uint *)&mf_local[0x242].find) {
              *(uint *)&mf_local[0x242].find = uVar9;
              make_short_rep((lzma_optimal *)&mf_local[0x242].read_limit);
            }
          }
          if ((&i)[buf_back._4_4_] < buf_avail) {
            local_fc = buf_avail;
          }
          else {
            local_fc = (&i)[buf_back._4_4_];
          }
          if (local_fc < 2) {
            *len_res_local = *(uint32_t *)&mf_local[0x242].skip;
            *_nice_len = 1;
            coder_local._4_4_ = 0xffffffff;
          }
          else {
            *(undefined4 *)((long)&mf_local[0x242].find + 4) = 0;
            for (i_2 = 0; i_2 < 4; i_2 = i_2 + 1) {
              (&mf_local[0x242].keep_size_after)[i_2] = (&mf_local[6].offset)[i_2];
            }
            rep_len = local_fc;
            do {
              *(undefined4 *)((long)&mf_local[0x242].buffer + (ulong)rep_len * 0x2c + 4) =
                   0x40000000;
              rep_len = rep_len - 1;
            } while (1 < rep_len);
            for (price = 0; price < 4; price = price + 1) {
              cur_and_len_price = (&i)[price];
              if (1 < cur_and_len_price) {
                uVar8 = get_pure_rep_price((lzma_lzma1_encoder *)mf_local,price,
                                           mf_local[6].keep_size_after,uVar6);
                do {
                  uVar10 = get_len_price((lzma_length_encoder *)&mf_local[0x18d].find,
                                         cur_and_len_price,uVar6);
                  uVar9 = uVar5 + uVar7 + uVar8 + uVar10;
                  if (uVar9 < *(uint *)((long)&mf_local[0x242].buffer +
                                       (ulong)cur_and_len_price * 0x2c + 4)) {
                    *(uint *)((long)&mf_local[0x242].buffer + (ulong)cur_and_len_price * 0x2c + 4) =
                         uVar9;
                    (&mf_local[0x242].size)[(ulong)cur_and_len_price * 0xb] = 0;
                    (&mf_local[0x242].keep_size_before)[(ulong)cur_and_len_price * 0xb] = price;
                    *(undefined1 *)(&mf_local[0x241].sons_count + (ulong)cur_and_len_price * 0xb) =
                         0;
                  }
                  cur_and_len_price = cur_and_len_price - 1;
                } while (1 < cur_and_len_price);
              }
            }
            uVar7 = rc_bit_0_price(*(probability *)
                                    ((long)&mf_local[0xe8].depth +
                                    (ulong)mf_local[6].keep_size_after * 2));
            if (i < 2) {
              local_10c = 2;
            }
            else {
              local_10c = i + 1;
            }
            rep_len = local_10c;
            if (local_10c <= buf_avail) {
              cur_and_len_price_1 = 0;
              while ((&mf_local[6].write_pos)[(ulong)cur_and_len_price_1 * 2] < local_10c) {
                cur_and_len_price_1 = cur_and_len_price_1 + 1;
              }
              while( true ) {
                uVar8 = (&mf_local[6].pending)[(ulong)cur_and_len_price_1 * 2];
                uVar10 = get_dist_len_price((lzma_lzma1_encoder *)mf_local,uVar8,rep_len,uVar6);
                uVar9 = uVar5 + uVar7 + uVar10;
                if (uVar9 < *(uint *)((long)&mf_local[0x242].buffer + (ulong)rep_len * 0x2c + 4)) {
                  *(uint *)((long)&mf_local[0x242].buffer + (ulong)rep_len * 0x2c + 4) = uVar9;
                  (&mf_local[0x242].size)[(ulong)rep_len * 0xb] = 0;
                  (&mf_local[0x242].keep_size_before)[(ulong)rep_len * 0xb] = uVar8 + 4;
                  *(undefined1 *)(&mf_local[0x241].sons_count + (ulong)rep_len * 0xb) = 0;
                }
                if ((rep_len == (&mf_local[6].write_pos)[(ulong)cur_and_len_price_1 * 2]) &&
                   (cur_and_len_price_1 = cur_and_len_price_1 + 1, cur_and_len_price_1 == local_68))
                break;
                rep_len = rep_len + 1;
              }
            }
            coder_local._4_4_ = local_fc;
          }
        }
      }
      else {
        *len_res_local = (&mf_local[6].pending)[(ulong)(local_68 - 1) * 2] + 4;
        *_nice_len = buf_avail;
        mf_skip((lzma_mf *)back_res_local,buf_avail - 1);
        coder_local._4_4_ = 0xffffffff;
      }
    }
    else {
      *len_res_local = buf_back._4_4_;
      *_nice_len = (&i)[buf_back._4_4_];
      mf_skip((lzma_mf *)back_res_local,*_nice_len - 1);
      coder_local._4_4_ = 0xffffffff;
    }
  }
  return coder_local._4_4_;
LAB_0022a52a:
  x._4_4_ = x._4_4_ + 8;
  goto LAB_0022a4a8;
}

Assistant:

static inline uint32_t
helper1(lzma_lzma1_encoder *restrict coder, lzma_mf *restrict mf,
		uint32_t *restrict back_res, uint32_t *restrict len_res,
		uint32_t position)
{
	const uint32_t nice_len = mf->nice_len;

	uint32_t len_main;
	uint32_t matches_count;

	if (mf->read_ahead == 0) {
		len_main = mf_find(mf, &matches_count, coder->matches);
	} else {
		assert(mf->read_ahead == 1);
		len_main = coder->longest_match_length;
		matches_count = coder->matches_count;
	}

	const uint32_t buf_avail = my_min(mf_avail(mf) + 1, MATCH_LEN_MAX);
	if (buf_avail < 2) {
		*back_res = UINT32_MAX;
		*len_res = 1;
		return UINT32_MAX;
	}

	const uint8_t *const buf = mf_ptr(mf) - 1;

	uint32_t rep_lens[REPS];
	uint32_t rep_max_index = 0;

	for (uint32_t i = 0; i < REPS; ++i) {
		const uint8_t *const buf_back = buf - coder->reps[i] - 1;

		if (not_equal_16(buf, buf_back)) {
			rep_lens[i] = 0;
			continue;
		}

		rep_lens[i] = lzma_memcmplen(buf, buf_back, 2, buf_avail);

		if (rep_lens[i] > rep_lens[rep_max_index])
			rep_max_index = i;
	}

	if (rep_lens[rep_max_index] >= nice_len) {
		*back_res = rep_max_index;
		*len_res = rep_lens[rep_max_index];
		mf_skip(mf, *len_res - 1);
		return UINT32_MAX;
	}


	if (len_main >= nice_len) {
		*back_res = coder->matches[matches_count - 1].dist + REPS;
		*len_res = len_main;
		mf_skip(mf, len_main - 1);
		return UINT32_MAX;
	}

	const uint8_t current_byte = *buf;
	const uint8_t match_byte = *(buf - coder->reps[0] - 1);

	if (len_main < 2 && current_byte != match_byte
			&& rep_lens[rep_max_index] < 2) {
		*back_res = UINT32_MAX;
		*len_res = 1;
		return UINT32_MAX;
	}

	coder->opts[0].state = coder->state;

	const uint32_t pos_state = position & coder->pos_mask;

	coder->opts[1].price = rc_bit_0_price(
				coder->is_match[coder->state][pos_state])
			+ get_literal_price(coder, position, buf[-1],
				!is_literal_state(coder->state),
				match_byte, current_byte);

	make_literal(&coder->opts[1]);

	const uint32_t match_price = rc_bit_1_price(
			coder->is_match[coder->state][pos_state]);
	const uint32_t rep_match_price = match_price
			+ rc_bit_1_price(coder->is_rep[coder->state]);

	if (match_byte == current_byte) {
		const uint32_t short_rep_price = rep_match_price
				+ get_short_rep_price(
					coder, coder->state, pos_state);

		if (short_rep_price < coder->opts[1].price) {
			coder->opts[1].price = short_rep_price;
			make_short_rep(&coder->opts[1]);
		}
	}

	const uint32_t len_end = my_max(len_main, rep_lens[rep_max_index]);

	if (len_end < 2) {
		*back_res = coder->opts[1].back_prev;
		*len_res = 1;
		return UINT32_MAX;
	}

	coder->opts[1].pos_prev = 0;

	for (uint32_t i = 0; i < REPS; ++i)
		coder->opts[0].backs[i] = coder->reps[i];

	uint32_t len = len_end;
	do {
		coder->opts[len].price = RC_INFINITY_PRICE;
	} while (--len >= 2);


	for (uint32_t i = 0; i < REPS; ++i) {
		uint32_t rep_len = rep_lens[i];
		if (rep_len < 2)
			continue;

		const uint32_t price = rep_match_price + get_pure_rep_price(
				coder, i, coder->state, pos_state);

		do {
			const uint32_t cur_and_len_price = price
					+ get_len_price(
						&coder->rep_len_encoder,
						rep_len, pos_state);

			if (cur_and_len_price < coder->opts[rep_len].price) {
				coder->opts[rep_len].price = cur_and_len_price;
				coder->opts[rep_len].pos_prev = 0;
				coder->opts[rep_len].back_prev = i;
				coder->opts[rep_len].prev_1_is_literal = false;
			}
		} while (--rep_len >= 2);
	}


	const uint32_t normal_match_price = match_price
			+ rc_bit_0_price(coder->is_rep[coder->state]);

	len = rep_lens[0] >= 2 ? rep_lens[0] + 1 : 2;
	if (len <= len_main) {
		uint32_t i = 0;
		while (len > coder->matches[i].len)
			++i;

		for(; ; ++len) {
			const uint32_t dist = coder->matches[i].dist;
			const uint32_t cur_and_len_price = normal_match_price
					+ get_dist_len_price(coder,
						dist, len, pos_state);

			if (cur_and_len_price < coder->opts[len].price) {
				coder->opts[len].price = cur_and_len_price;
				coder->opts[len].pos_prev = 0;
				coder->opts[len].back_prev = dist + REPS;
				coder->opts[len].prev_1_is_literal = false;
			}

			if (len == coder->matches[i].len)
				if (++i == matches_count)
					break;
		}
	}

	return len_end;
}